

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O2

void __thiscall
burst::dynamic_tuple::push_back<(anonymous_namespace)::dummy>(dynamic_tuple *this,dummy *object)

{
  size_t sVar1;
  char *pcVar2;
  dummy *pdVar3;
  undefined1 uVar4;
  undefined1 extraout_DL;
  undefined7 in_register_00000011;
  undefined7 extraout_var;
  bool bVar5;
  
  sVar1 = this->m_volume;
  pcVar2 = (this->m_data)._M_t.
           super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
           super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
           super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
  bVar5 = this->m_capacity == sVar1;
  uVar4 = pcVar2 == (char *)0x0 || bVar5;
  if (pcVar2 == (char *)0x0 || bVar5) {
    pdVar3 = (dummy *)(sVar1 + 2);
    reserve(this,(size_t)pdVar3);
    pdVar3 = (dummy *)force_align<(anonymous_namespace)::dummy>(this,pdVar3);
    uVar4 = extraout_DL;
    in_register_00000011 = extraout_var;
  }
  else {
    pdVar3 = (dummy *)(pcVar2 + sVar1);
  }
  accomodate<(anonymous_namespace)::dummy>
            (this,pdVar3,(int8_t *)CONCAT71(in_register_00000011,uVar4));
  return;
}

Assistant:

void push_back (T && object)
        {
            auto creation_place = set_up_creation_place(object);
            accomodate(std::forward<T>(object), creation_place);
        }